

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtTriangleInfo>::push_back
          (cbtAlignedObjectArray<cbtTriangleInfo> *this,cbtTriangleInfo *_Val)

{
  cbtTriangleInfo *pcVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  int iVar5;
  int _Count;
  
  iVar5 = this->m_size;
  if (iVar5 == this->m_capacity) {
    _Count = 1;
    if (iVar5 != 0) {
      _Count = iVar5 * 2;
    }
    reserve(this,_Count);
    iVar5 = this->m_size;
  }
  cVar2 = _Val->m_edgeV0V1Angle;
  cVar3 = _Val->m_edgeV1V2Angle;
  cVar4 = _Val->m_edgeV2V0Angle;
  pcVar1 = this->m_data + iVar5;
  pcVar1->m_flags = _Val->m_flags;
  pcVar1->m_edgeV0V1Angle = cVar2;
  pcVar1->m_edgeV1V2Angle = cVar3;
  pcVar1->m_edgeV2V0Angle = cVar4;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void push_back(const T& _Val)
	{
		const int sz = size();
		if (sz == capacity())
		{
			reserve(allocSize(size()));
		}

#ifdef BT_USE_PLACEMENT_NEW
		new (&m_data[m_size]) T(_Val);
#else
		m_data[size()] = _Val;
#endif  //BT_USE_PLACEMENT_NEW

		m_size++;
	}